

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.hpp
# Opt level: O2

NodeChildren * __thiscall
duckdb::BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::ExtractChildren
          (NodeChildren *__return_storage_ptr__,
          BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *this,ArenaAllocator *arena)

{
  byte bVar1;
  byte bVar2;
  data_t dVar3;
  data_ptr_t pdVar4;
  Node *pNVar5;
  uint8_t i;
  ulong index;
  
  pdVar4 = ArenaAllocator::AllocateAligned(arena,(ulong)this->count);
  bVar1 = this->count;
  array_ptr<unsigned_char,_true>::AssertNotNull(pdVar4 == (data_ptr_t)0x0);
  pNVar5 = (Node *)ArenaAllocator::AllocateAligned(arena,(ulong)this->count << 3);
  bVar2 = this->count;
  array_ptr<duckdb::Node,_true>::AssertNotNull(pNVar5 == (Node *)0x0);
  for (index = 0; index < this->count; index = index + 1) {
    dVar3 = this->key[index];
    array_ptr<unsigned_char,_true>::AssertIndexInBounds(index,(ulong)bVar1);
    pdVar4[index] = dVar3;
    array_ptr<duckdb::Node,_true>::AssertIndexInBounds(index,(ulong)bVar2);
    pNVar5[index].super_IndexPointer.data = this->children[index].super_IndexPointer.data;
  }
  this->count = '\0';
  (__return_storage_ptr__->bytes).ptr = pdVar4;
  (__return_storage_ptr__->bytes).count = (ulong)bVar1;
  (__return_storage_ptr__->children).ptr = pNVar5;
  (__return_storage_ptr__->children).count = (ulong)bVar2;
  return __return_storage_ptr__;
}

Assistant:

NodeChildren ExtractChildren(ArenaAllocator &arena) {
		auto mem_bytes = arena.AllocateAligned(sizeof(uint8_t) * count);
		array_ptr<uint8_t> bytes(mem_bytes, count);
		auto mem_children = arena.AllocateAligned(sizeof(Node) * count);
		array_ptr<Node> children_ptr(reinterpret_cast<Node *>(mem_children), count);

		for (uint8_t i = 0; i < count; i++) {
			bytes[i] = key[i];
			children_ptr[i] = children[i];
		}

		count = 0;
		return NodeChildren(bytes, children_ptr);
	}